

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O0

void nn_cws_start_resolving(nn_cws *self)

{
  char *__s;
  size_t sVar1;
  long in_RDI;
  nn_ep *unaff_retaddr;
  char *host;
  size_t ipv4onlylen;
  int ipv4only;
  nn_dns_result *in_stack_00000030;
  int in_stack_0000003c;
  size_t in_stack_00000040;
  char *in_stack_00000048;
  nn_dns *in_stack_00000050;
  long lVar2;
  void *in_stack_fffffffffffffff0;
  
  lVar2 = 4;
  nn_ep_getopt(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffff0,
               (size_t *)0x4);
  if (lVar2 != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
            ,0x247);
    fflush(_stderr);
    nn_err_abort();
  }
  __s = (char *)nn_chunkref_data((nn_chunkref *)(in_RDI + 0x1c28));
  sVar1 = strlen(__s);
  if (sVar1 == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (host) > 0",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
            ,0x24a);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_dns_start(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,
               in_stack_00000030);
  *(undefined4 *)(in_RDI + 0x58) = 2;
  return;
}

Assistant:

static void nn_cws_start_resolving (struct nn_cws *self)
{
    int ipv4only;
    size_t ipv4onlylen;
    char *host;

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    host = nn_chunkref_data (&self->remote_host);
    nn_assert (strlen (host) > 0);

    nn_dns_start (&self->dns, host, self->remote_hostname_len, ipv4only,
        &self->dns_result);

    self->state = NN_CWS_STATE_RESOLVING;
}